

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::Texture2DShadowTestInstance::~Texture2DShadowTestInstance
          (Texture2DShadowTestInstance *this)

{
  Texture2DShadowTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DShadowTestInstance_01671ce0;
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::clear(&this->m_textures);
  std::
  vector<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
  ::clear(&this->m_cases);
  util::TextureRenderer::~TextureRenderer(&this->m_renderer);
  std::
  vector<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
  ::~vector(&this->m_cases);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::~vector(&this->m_textures);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

Texture2DShadowTestInstance::~Texture2DShadowTestInstance (void)
{
	m_textures.clear();
	m_cases.clear();
}